

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmpat.cpp
# Opt level: O0

vm_obj_id_t CVmObjPattern::create_from_stack(uchar **pc_ptr,uint argc)

{
  re_status_t rVar1;
  vm_obj_id_t vVar2;
  char *pcVar3;
  vm_val_t *src_str;
  int in_ESI;
  re_compiled_pattern **in_stack_00000010;
  size_t in_stack_00000018;
  char *in_stack_00000020;
  CRegexParser *in_stack_00000028;
  vm_obj_id_t id;
  re_compiled_pattern *pat;
  re_status_t stat;
  char *strval;
  undefined4 in_stack_ffffffffffffffa8;
  vm_obj_id_t in_stack_ffffffffffffffac;
  size_t in_stack_ffffffffffffffb0;
  CRegexParser *this;
  re_compiled_pattern *local_28;
  
  if (in_ESI != 1) {
    err_throw(0);
  }
  CVmStack::get(0);
  pcVar3 = vm_val_t::get_as_string
                     ((vm_val_t *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
  if (pcVar3 == (char *)0x0) {
    err_throw(0);
  }
  this = G_bif_tads_globals_X->rex_parser;
  vmb_get_len((char *)0x3801f0);
  rVar1 = CRegexParser::compile_pattern
                    (in_stack_00000028,in_stack_00000020,in_stack_00000018,in_stack_00000010);
  if (rVar1 != RE_STATUS_SUCCESS) {
    err_throw(0);
  }
  vVar2 = vm_new_id((int)(in_stack_ffffffffffffffb0 >> 0x20),(int)in_stack_ffffffffffffffb0,
                    in_stack_ffffffffffffffac);
  src_str = (vm_val_t *)CVmObject::operator_new(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac)
  ;
  CVmStack::get(0);
  CVmObjPattern((CVmObjPattern *)this,local_28,src_str);
  CVmStack::discard();
  return vVar2;
}

Assistant:

vm_obj_id_t CVmObjPattern::create_from_stack(VMG_ const uchar **pc_ptr,
                                             uint argc)
{
    const char *strval;
    re_status_t stat;
    re_compiled_pattern *pat;
    vm_obj_id_t id;

    /* check arguments */
    if (argc != 1)
        err_throw(VMERR_WRONG_NUM_OF_ARGS);

    /* retrieve the string, but leave it on the stack */
    strval = G_stk->get(0)->get_as_string(vmg0_);
    if (strval == 0)
        err_throw(VMERR_STRING_VAL_REQD);

    /* compile the string */
    stat = G_bif_tads_globals->rex_parser->compile_pattern(
        strval + VMB_LEN, vmb_get_len(strval), &pat);

    /* if we failed to compile the pattern, throw an error */
    if (stat != RE_STATUS_SUCCESS)
        err_throw(VMERR_BAD_TYPE_BIF);

    /* create a new pattern object to hold the pattern */
    id = vm_new_id(vmg_ FALSE, TRUE, FALSE);
    new (vmg_ id) CVmObjPattern(vmg_ pat, G_stk->get(0));

    /* discard arguments */
    G_stk->discard();

    /* return the new object */
    return id;
}